

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

UDate __thiscall
icu_63::CalendarAstronomer::timeOfAngle
          (CalendarAstronomer *this,AngleFunc *func,double desired,double periodDays,double epsilon,
          UBool next)

{
  double extraout_XMM0_Qa;
  double dVar1;
  double extraout_XMM0_Qa_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_80;
  double local_78;
  double local_40;
  UDate local_30;
  
  (**func->_vptr_AngleFunc)(func,this);
  dVar1 = uprv_floor_63((desired - extraout_XMM0_Qa) / 6.283185307179586);
  dVar4 = -6.283185307179586;
  if (next != '\0') {
    dVar4 = 0.0;
  }
  local_80 = ((dVar4 + dVar1 * -6.283185307179586 + (desired - extraout_XMM0_Qa)) *
             periodDays * 86400000.0) / 6.283185307179586;
  dVar1 = this->fTime;
  dVar4 = uprv_ceil_63(local_80);
  this->fTime = dVar4 + dVar1;
  dVar4 = uprv_getNaN_63();
  this->julianDay = dVar4;
  this->julianCentury = dVar4;
  this->sunLongitude = dVar4;
  this->meanAnomalySun = dVar4;
  this->moonLongitude = dVar4;
  this->moonEclipLong = dVar4;
  this->meanAnomalyMoon = dVar4;
  this->eclipObliquity = dVar4;
  this->siderealTime = dVar4;
  this->siderealT0 = dVar4;
  this->moonPositionSet = '\0';
  local_78 = local_80;
  local_40 = extraout_XMM0_Qa;
  while( true ) {
    (**func->_vptr_AngleFunc)(func,this);
    dVar5 = (extraout_XMM0_Qa_00 - local_40) + 3.141592653589793;
    dVar4 = uprv_floor_63(dVar5 / 6.283185307179586);
    local_80 = uprv_fabs_63(local_80 / (dVar4 * -6.283185307179586 + dVar5 + -3.141592653589793));
    dVar4 = (desired - extraout_XMM0_Qa_00) + 3.141592653589793;
    dVar5 = uprv_floor_63(dVar4 / 6.283185307179586);
    local_80 = (dVar5 * -6.283185307179586 + dVar4 + -3.141592653589793) * local_80;
    dVar4 = uprv_fabs_63(local_80);
    dVar5 = uprv_fabs_63(local_78);
    if (dVar5 < dVar4) {
      dVar3 = uprv_ceil_63(periodDays * 86400000.0 * 0.125);
      if (next == '\0') {
        dVar3 = -dVar3;
      }
      this->fTime = dVar3 + dVar1;
      dVar3 = uprv_getNaN_63();
      this->julianDay = dVar3;
      this->julianCentury = dVar3;
      this->sunLongitude = dVar3;
      this->meanAnomalySun = dVar3;
      this->moonLongitude = dVar3;
      this->moonEclipLong = dVar3;
      this->meanAnomalyMoon = dVar3;
      this->eclipObliquity = dVar3;
      this->siderealTime = dVar3;
      this->siderealT0 = dVar3;
      this->moonPositionSet = '\0';
      local_30 = timeOfAngle(this,func,desired,periodDays,epsilon,next);
    }
    else {
      dVar3 = this->fTime;
      dVar2 = uprv_ceil_63(local_80);
      this->fTime = dVar2 + dVar3;
      dVar3 = uprv_getNaN_63();
      this->julianDay = dVar3;
      this->julianCentury = dVar3;
      this->sunLongitude = dVar3;
      this->meanAnomalySun = dVar3;
      this->moonLongitude = dVar3;
      this->moonEclipLong = dVar3;
      this->meanAnomalyMoon = dVar3;
      this->eclipObliquity = dVar3;
      this->siderealTime = dVar3;
      this->siderealT0 = dVar3;
      this->moonPositionSet = '\0';
      local_78 = local_80;
      local_40 = extraout_XMM0_Qa_00;
    }
    if (dVar5 < dVar4) break;
    dVar4 = uprv_fabs_63(local_80);
    if (dVar4 <= epsilon) {
      return this->fTime;
    }
  }
  return local_30;
}

Assistant:

UDate CalendarAstronomer::timeOfAngle(AngleFunc& func, double desired,
                                      double periodDays, double epsilon, UBool next)
{
    // Find the value of the function at the current time
    double lastAngle = func.eval(*this);

    // Find out how far we are from the desired angle
    double deltaAngle = norm2PI(desired - lastAngle) ;

    // Using the average period, estimate the next (or previous) time at
    // which the desired angle occurs.
    double deltaT =  (deltaAngle + (next ? 0.0 : - CalendarAstronomer_PI2 )) * (periodDays*DAY_MS) / CalendarAstronomer_PI2;

    double lastDeltaT = deltaT; // Liu
    UDate startTime = fTime; // Liu

    setTime(fTime + uprv_ceil(deltaT));

    // Now iterate until we get the error below epsilon.  Throughout
    // this loop we use normPI to get values in the range -Pi to Pi,
    // since we're using them as correction factors rather than absolute angles.
    do {
        // Evaluate the function at the time we've estimated
        double angle = func.eval(*this);

        // Find the # of milliseconds per radian at this point on the curve
        double factor = uprv_fabs(deltaT / normPI(angle-lastAngle));

        // Correct the time estimate based on how far off the angle is
        deltaT = normPI(desired - angle) * factor;

        // HACK:
        //
        // If abs(deltaT) begins to diverge we need to quit this loop.
        // This only appears to happen when attempting to locate, for
        // example, a new moon on the day of the new moon.  E.g.:
        //
        // This result is correct:
        // newMoon(7508(Mon Jul 23 00:00:00 CST 1990,false))=
        //   Sun Jul 22 10:57:41 CST 1990
        //
        // But attempting to make the same call a day earlier causes deltaT
        // to diverge:
        // CalendarAstronomer.timeOfAngle() diverging: 1.348508727575625E9 ->
        //   1.3649828540224032E9
        // newMoon(7507(Sun Jul 22 00:00:00 CST 1990,false))=
        //   Sun Jul 08 13:56:15 CST 1990
        //
        // As a temporary solution, we catch this specific condition and
        // adjust our start time by one eighth period days (either forward
        // or backward) and try again.
        // Liu 11/9/00
        if (uprv_fabs(deltaT) > uprv_fabs(lastDeltaT)) {
            double delta = uprv_ceil (periodDays * DAY_MS / 8.0);
            setTime(startTime + (next ? delta : -delta));
            return timeOfAngle(func, desired, periodDays, epsilon, next);
        }

        lastDeltaT = deltaT;
        lastAngle = angle;

        setTime(fTime + uprv_ceil(deltaT));
    }
    while (uprv_fabs(deltaT) > epsilon);

    return fTime;
}